

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Select * sqlite3MultiValues(Parse *pParse,Select *pLeft,ExprList *pRow)

{
  anon_union_8_3_fafd40d6_for_u1 *paVar1;
  byte *pbVar2;
  undefined1 *puVar3;
  SrcList *pSVar4;
  ExprList *pRow_00;
  Select *pSVar5;
  Subquery *pSVar6;
  char cVar7;
  u32 selFlags;
  int iVar8;
  Select *pSVar9;
  Vdbe *p;
  long lVar10;
  int p3;
  ExprList_item *pEVar11;
  SrcItem *pItem;
  long in_FS_OFFSET;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 *local_58;
  char *pcStack_50;
  ExprList *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((pParse->bHasWith == '\0') && ((pParse->db->init).busy == '\0')) &&
     (iVar8 = exprListIsConstant(pParse,pRow), iVar8 != 0)) {
    if (pLeft->pSrc->nSrc == 0) {
      pRow_00 = pLeft->pEList;
      iVar8 = exprListIsConstant(pParse,pRow_00);
      if (iVar8 == 0) goto LAB_00169c39;
      if (0 < pRow_00->nExpr) {
        pEVar11 = pRow_00->a;
        lVar10 = 0;
        do {
          cVar7 = sqlite3ExprAffinity(pEVar11->pExpr);
          if (cVar7 != '\0') goto LAB_00169c39;
          lVar10 = lVar10 + 1;
          pEVar11 = pEVar11 + 1;
        } while (lVar10 < pRow_00->nExpr);
      }
    }
    if (pParse->eParseMode == '\0') {
      pSVar4 = pLeft->pSrc;
      if (pSVar4->nSrc == 0) {
        p = sqlite3GetVdbe(pParse);
        pSVar9 = sqlite3SelectNew(pParse,(ExprList *)0x0,(SrcList *)0x0,(Expr *)0x0,(ExprList *)0x0,
                                  (Expr *)0x0,(ExprList *)0x0,0,(Expr *)0x0);
        if ((pParse->db->mDbFlags & 0x10) == 0) {
          sqlite3ReadSchema(pParse);
        }
        if (pSVar9 == (Select *)0x0) {
          pItem = (SrcItem *)0x0;
          pSVar9 = pLeft;
        }
        else {
          local_48 = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          pcStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          uStack_60 = &DAT_aaaaaaaaaaaaaaaa;
          pSVar4 = pSVar9->pSrc;
          pSVar4->nSrc = 1;
          pSVar5 = pLeft->pPrior;
          pSVar9->pPrior = pSVar5;
          pSVar9->op = pLeft->op;
          if (pSVar5 != (Select *)0x0) {
            pbVar2 = (byte *)((long)&pSVar9->selFlags + 1);
            *pbVar2 = *pbVar2 | 2;
          }
          pLeft->pPrior = (Select *)0x0;
          pLeft->op = 0x8b;
          puVar3 = &pSVar4->a[0].fg.field_0x1;
          *puVar3 = *puVar3 | 0x40;
          pItem = pSVar4->a;
          pSVar4->a[0].iCursor = -1;
          pSVar4->a[0].u1.nRow = 2;
          iVar8 = sqlite3SrcItemAttachSubquery(pParse,pItem,pLeft,0);
          if (iVar8 != 0) {
            pSVar6 = pSVar4->a[0].u4.pSubq;
            p3 = p->nOp + 1;
            pSVar6->addrFillSub = p3;
            iVar8 = pParse->nMem + 1;
            pParse->nMem = iVar8;
            pSVar6->regReturn = iVar8;
            sqlite3VdbeAddOp3(p,0xb,iVar8,0,p3);
            local_68._0_1_ = '\r';
            local_68 = (undefined1 *)CONCAT44(pSVar6->regReturn,(undefined4)local_68);
            pcStack_50 = (char *)0x0;
            uStack_60 = (undefined1 *)((ulong)(pParse->nMem + 3) << 0x20);
            iVar8 = pLeft->pEList->nExpr;
            local_58 = (undefined1 *)CONCAT44(local_58._4_4_,iVar8);
            pParse->nMem = pParse->nMem + iVar8 + 2;
            pbVar2 = (byte *)((long)&pLeft->selFlags + 1);
            *pbVar2 = *pbVar2 | 4;
            sqlite3Select(pParse,pLeft,(SelectDest *)&local_68);
            pSVar6->regResult = uStack_60._4_4_;
          }
        }
      }
      else {
        paVar1 = &pSVar4->a[0].u1;
        paVar1->nRow = paVar1->nRow + 1;
        pItem = pSVar4->a;
        pSVar9 = pLeft;
      }
      pLeft = pSVar9;
      if (pParse->nErr == 0) {
        pSVar6 = (pItem->u4).pSubq;
        if (pSVar6->pSelect->pEList->nExpr == pRow->nExpr) {
          sqlite3ExprCodeExprList(pParse,pRow,pSVar6->regResult,0,'\0');
          sqlite3VdbeAddOp3(pParse->pVdbe,0xc,pSVar6->regReturn,0,0);
        }
        else {
          sqlite3SelectWrongNumTermsError(pParse,pSVar6->pSelect);
        }
      }
      else if (pRow == (ExprList *)0x0) goto LAB_00169cff;
      exprListDeleteNN(pParse->db,pRow);
      goto LAB_00169cff;
    }
  }
LAB_00169c39:
  if (pLeft->pSrc->nSrc == 0) {
    if (pLeft->pPrior == (Select *)0x0) {
      selFlags = 0x600;
    }
    else {
      selFlags = pLeft->selFlags & 0x600;
    }
  }
  else {
    sqlite3MultiValuesEnd(pParse,pLeft);
    selFlags = 0x200;
  }
  pSVar9 = sqlite3SelectNew(pParse,pRow,(SrcList *)0x0,(Expr *)0x0,(ExprList *)0x0,(Expr *)0x0,
                            (ExprList *)0x0,selFlags,(Expr *)0x0);
  pbVar2 = (byte *)((long)&pLeft->selFlags + 1);
  *pbVar2 = *pbVar2 & 0xfb;
  if (pSVar9 != (Select *)0x0) {
    pSVar9->op = 0x88;
    pSVar9->pPrior = pLeft;
    pLeft = pSVar9;
  }
LAB_00169cff:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pLeft;
}

Assistant:

SQLITE_PRIVATE Select *sqlite3MultiValues(Parse *pParse, Select *pLeft, ExprList *pRow){

  if( pParse->bHasWith                   /* condition (a) above */
   || pParse->db->init.busy              /* condition (b) above */
   || exprListIsConstant(pParse,pRow)==0 /* condition (c) above */
   || (pLeft->pSrc->nSrc==0 &&
       exprListIsNoAffinity(pParse,pLeft->pEList)==0) /* condition (d) above */
   || IN_SPECIAL_PARSE
  ){
    /* The co-routine method cannot be used. Fall back to UNION ALL. */
    Select *pSelect = 0;
    int f = SF_Values | SF_MultiValue;
    if( pLeft->pSrc->nSrc ){
      sqlite3MultiValuesEnd(pParse, pLeft);
      f = SF_Values;
    }else if( pLeft->pPrior ){
      /* In this case set the SF_MultiValue flag only if it was set on pLeft */
      f = (f & pLeft->selFlags);
    }
    pSelect = sqlite3SelectNew(pParse, pRow, 0, 0, 0, 0, 0, f, 0);
    pLeft->selFlags &= ~SF_MultiValue;
    if( pSelect ){
      pSelect->op = TK_ALL;
      pSelect->pPrior = pLeft;
      pLeft = pSelect;
    }
  }else{
    SrcItem *p = 0;               /* SrcItem that reads from co-routine */

    if( pLeft->pSrc->nSrc==0 ){
      /* Co-routine has not yet been started and the special Select object
      ** that accesses the co-routine has not yet been created. This block
      ** does both those things. */
      Vdbe *v = sqlite3GetVdbe(pParse);
      Select *pRet = sqlite3SelectNew(pParse, 0, 0, 0, 0, 0, 0, 0, 0);

      /* Ensure the database schema has been read. This is to ensure we have
      ** the correct text encoding.  */
      if( (pParse->db->mDbFlags & DBFLAG_SchemaKnownOk)==0 ){
        sqlite3ReadSchema(pParse);
      }

      if( pRet ){
        SelectDest dest;
        Subquery *pSubq;
        pRet->pSrc->nSrc = 1;
        pRet->pPrior = pLeft->pPrior;
        pRet->op = pLeft->op;
        if( pRet->pPrior ) pRet->selFlags |= SF_Values;
        pLeft->pPrior = 0;
        pLeft->op = TK_SELECT;
        assert( pLeft->pNext==0 );
        assert( pRet->pNext==0 );
        p = &pRet->pSrc->a[0];
        p->fg.viaCoroutine = 1;
        p->iCursor = -1;
        assert( !p->fg.isIndexedBy && !p->fg.isTabFunc );
        p->u1.nRow = 2;
        if( sqlite3SrcItemAttachSubquery(pParse, p, pLeft, 0) ){
          pSubq = p->u4.pSubq;
          pSubq->addrFillSub = sqlite3VdbeCurrentAddr(v) + 1;
          pSubq->regReturn = ++pParse->nMem;
          sqlite3VdbeAddOp3(v, OP_InitCoroutine,
                            pSubq->regReturn, 0, pSubq->addrFillSub);
          sqlite3SelectDestInit(&dest, SRT_Coroutine, pSubq->regReturn);

          /* Allocate registers for the output of the co-routine. Do so so
          ** that there are two unused registers immediately before those
          ** used by the co-routine. This allows the code in sqlite3Insert()
          ** to use these registers directly, instead of copying the output
          ** of the co-routine to a separate array for processing.  */
          dest.iSdst = pParse->nMem + 3;
          dest.nSdst = pLeft->pEList->nExpr;
          pParse->nMem += 2 + dest.nSdst;

          pLeft->selFlags |= SF_MultiValue;
          sqlite3Select(pParse, pLeft, &dest);
          pSubq->regResult = dest.iSdst;
          assert( pParse->nErr || dest.iSdst>0 );
        }
        pLeft = pRet;
      }
    }else{
      p = &pLeft->pSrc->a[0];
      assert( !p->fg.isTabFunc && !p->fg.isIndexedBy );
      p->u1.nRow++;
    }

    if( pParse->nErr==0 ){
      Subquery *pSubq;
      assert( p!=0 );
      assert( p->fg.isSubquery );
      pSubq = p->u4.pSubq;
      assert( pSubq!=0 );
      assert( pSubq->pSelect!=0 );
      assert( pSubq->pSelect->pEList!=0 );
      if( pSubq->pSelect->pEList->nExpr!=pRow->nExpr ){
        sqlite3SelectWrongNumTermsError(pParse, pSubq->pSelect);
      }else{
        sqlite3ExprCodeExprList(pParse, pRow, pSubq->regResult, 0, 0);
        sqlite3VdbeAddOp1(pParse->pVdbe, OP_Yield, pSubq->regReturn);
      }
    }
    sqlite3ExprListDelete(pParse->db, pRow);
  }

  return pLeft;
}